

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Skip(CopyingInputStreamAdaptor *this,int count)

{
  int iVar1;
  LogMessage *this_00;
  int in_ESI;
  long in_RDI;
  int skipped;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  LogMessage local_50;
  int local_14;
  bool local_1;
  
  local_14 = in_ESI;
  if (in_ESI < 0) {
    other = &local_50;
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (LogLevel)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff80,
               (int)((ulong)other >> 0x20));
    this_00 = internal::LogMessage::operator<<(in_stack_ffffffffffffff80,(char *)other);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x5cd9ab);
  }
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    if (*(int *)(in_RDI + 0x30) < local_14) {
      local_14 = local_14 - *(int *)(in_RDI + 0x30);
      *(undefined4 *)(in_RDI + 0x30) = 0;
      iVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),local_14);
      *(long *)(in_RDI + 0x18) = (long)iVar1 + *(long *)(in_RDI + 0x18);
      local_1 = iVar1 == local_14;
    }
    else {
      *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) - local_14;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CopyingInputStreamAdaptor::Skip(int count) {
  GOOGLE_CHECK_GE(count, 0);

  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  // First skip any bytes left over from a previous BackUp().
  if (backup_bytes_ >= count) {
    // We have more data left over than we're trying to skip.  Just chop it.
    backup_bytes_ -= count;
    return true;
  }

  count -= backup_bytes_;
  backup_bytes_ = 0;

  int skipped = copying_stream_->Skip(count);
  position_ += skipped;
  return skipped == count;
}